

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

BOOL Js::JavascriptNumber::GetThisValue(Var aValue,double *pDouble)

{
  code *pcVar1;
  double dVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  JavascriptTypedNumber<long> *pJVar6;
  JavascriptTypedNumber<unsigned_long> *pJVar7;
  JavascriptNumberObject *this_00;
  Type TVar8;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00ceaa63;
    *puVar5 = 0;
  }
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00ceaa63;
    *puVar5 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
     (TVar8 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00ceaa63;
      *puVar5 = 0;
    }
    TVar8 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00ceaa63:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  if ((int)TVar8 < 2) {
    return 0;
  }
  if (TVar8 == TypeIds_LastNumberType) {
    pJVar7 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    *pDouble = ((double)CONCAT44(0x43300000,(int)pJVar7->m_value) - 4503599627370496.0) +
               ((double)CONCAT44(0x45300000,(int)(pJVar7->m_value >> 0x20)) - 1.9342813113834067e+25
               );
  }
  else {
    if (TVar8 == TypeIds_Int64Number) {
      pJVar6 = VarTo<Js::JavascriptTypedNumber<long>>(aValue);
      dVar2 = (double)pJVar6->m_value;
    }
    else if (TVar8 == TypeIds_FirstNumberType) {
      dVar2 = (double)(int)aValue;
    }
    else {
      if ((ulong)aValue >> 0x32 != 0) {
        *pDouble = (double)((ulong)aValue ^ 0xfffc000000000000);
        return 1;
      }
      if (TVar8 != TypeIds_NumberObject) {
        return 0;
      }
      this_00 = VarTo<Js::JavascriptNumberObject>(aValue);
      dVar2 = JavascriptNumberObject::GetValue(this_00);
    }
    *pDouble = dVar2;
  }
  return 1;
}

Assistant:

BOOL JavascriptNumber::GetThisValue(Var aValue, double* pDouble)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(aValue);

        if (typeId <= TypeIds_UndefinedOrNull)
        {
            return FALSE;
        }

        if (typeId == TypeIds_Integer)
        {
            *pDouble = TaggedInt::ToDouble(aValue);
            return TRUE;
        }
        else if (typeId == TypeIds_Int64Number)
        {
            *pDouble = (double)VarTo<JavascriptInt64Number>(aValue)->GetValue();
            return TRUE;
        }
        else if (typeId == TypeIds_UInt64Number)
        {
            *pDouble = (double)VarTo<JavascriptUInt64Number>(aValue)->GetValue();
            return TRUE;
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(aValue))
        {
            *pDouble = JavascriptNumber::GetValue(aValue);
            return TRUE;
        }
        else if (typeId == TypeIds_NumberObject)
        {
            JavascriptNumberObject* obj = VarTo<JavascriptNumberObject>(aValue);
            *pDouble = obj->GetValue();
            return TRUE;
        }
        else
        {
            return FALSE;
        }
    }